

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O0

void __thiscall spvtools::opt::DominatorTree::ResetDFNumbering(DominatorTree *this)

{
  bool bVar1;
  reference ppDVar2;
  DominatorTreeNode *root;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
  *__range2;
  anon_class_1_0_00000001 getSucc;
  anon_class_8_1_a81517f2 postFunc;
  anon_class_8_1_a81517f2 preFunc;
  int index;
  DominatorTree *this_local;
  
  preFunc.index._4_4_ = 0;
  __end2 = std::
           vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
           ::begin(&this->roots_);
  root = (DominatorTreeNode *)
         std::
         vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
         ::end(&this->roots_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                                *)&root);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
              ::operator*(&__end2);
    (anonymous_namespace)::
    DepthFirstSearch<spvtools::opt::DominatorTreeNode,spvtools::opt::DominatorTree::ResetDFNumbering()::__0,spvtools::opt::DominatorTree::ResetDFNumbering()::__1,spvtools::opt::DominatorTree::ResetDFNumbering()::__2>
              (*ppDVar2,(undefined1 *)((long)&preFunc.index + 4),
               (undefined1 *)((long)&preFunc.index + 4));
    __gnu_cxx::
    __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void DominatorTree::ResetDFNumbering() {
  int index = 0;
  auto preFunc = [&index](const DominatorTreeNode* node) {
    const_cast<DominatorTreeNode*>(node)->dfs_num_pre_ = ++index;
  };

  auto postFunc = [&index](const DominatorTreeNode* node) {
    const_cast<DominatorTreeNode*>(node)->dfs_num_post_ = ++index;
  };

  auto getSucc = [](const DominatorTreeNode* node) { return &node->children_; };

  for (auto root : roots_) DepthFirstSearch(root, getSucc, preFunc, postFunc);
}